

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O1

RK_S32 mpp_av1_film_grain_params
                 (AV1Context *ctx,BitReadCtx_t *gb,AV1RawFilmGrainParams *current,
                 AV1RawFrameHeader *frame_header)

{
  byte bVar1;
  AV1RawSequenceHeader *pAVar2;
  uint uVar3;
  RK_S32 RVar4;
  ulong in_RAX;
  uint uVar5;
  RK_U32 RVar6;
  ulong uVar7;
  ulong uVar8;
  RK_U32 value;
  undefined8 local_38;
  
  pAVar2 = ctx->sequence_header;
  RVar4 = 0;
  if ((pAVar2->film_grain_params_present != '\0') &&
     ((frame_header->show_frame != '\0' || (frame_header->showable_frame != '\0')))) {
    local_38 = in_RAX;
    RVar4 = mpp_av1_read_unsigned(gb,1,"apply_grain",(RK_U32 *)&local_38,0,1);
    if (-1 < RVar4) {
      current->apply_grain = (RK_U8)local_38;
      RVar4 = 0;
      if ((RK_U8)local_38 != '\0') {
        RVar4 = mpp_av1_read_unsigned(gb,0x10,"grain_seed",(RK_U32 *)&local_38,0,0xffff);
        if (RVar4 < 0) {
          RVar4 = -1;
        }
        else {
          current->grain_seed = (RK_U16)local_38;
          if (frame_header->frame_type == '\x01') {
            RVar4 = mpp_av1_read_unsigned(gb,1,"update_grain",(RK_U32 *)&local_38,0,1);
            if (RVar4 < 0) {
              return -1;
            }
            current->update_grain = (RK_U8)local_38;
          }
          else {
            current->update_grain = '\x01';
          }
          if (current->update_grain == '\0') {
            RVar4 = mpp_av1_read_unsigned(gb,3,"film_grain_params_ref_idx",(RK_U32 *)&local_38,0,7);
            if (-1 < RVar4) {
              current->film_grain_params_ref_idx = (RK_U8)local_38;
              return 0;
            }
          }
          else {
            RVar4 = mpp_av1_read_unsigned(gb,4,"num_y_points",(RK_U32 *)&local_38,0,0xe);
            if (RVar4 < 0) {
              return -1;
            }
            current->num_y_points = (RK_U8)local_38;
            uVar8 = (ulong)current->num_y_points;
            if (current->num_y_points != 0) {
              uVar7 = 0;
              do {
                RVar6 = 0;
                if (uVar7 != 0) {
                  RVar6 = current->point_y_value[uVar7 - 1] + 1;
                }
                RVar4 = mpp_av1_read_unsigned
                                  (gb,8,"point_y_value[i]",(RK_U32 *)&local_38,RVar6,
                                   ((int)uVar7 - (int)uVar8) + 0x100);
                if (RVar4 < 0) {
                  return -1;
                }
                current->point_y_value[uVar7] = (RK_U8)local_38;
                RVar4 = mpp_av1_read_unsigned(gb,8,"point_y_scaling[i]",(RK_U32 *)&local_38,0,0xff);
                if (RVar4 < 0) {
                  return -1;
                }
                current->point_y_scaling[uVar7] = (RK_U8)local_38;
                uVar7 = uVar7 + 1;
                uVar8 = (ulong)current->num_y_points;
              } while (uVar7 < uVar8);
            }
            if ((pAVar2->color_config).mono_chrome == '\0') {
              RVar4 = mpp_av1_read_unsigned(gb,1,"chroma_scaling_from_luma",(RK_U32 *)&local_38,0,1)
              ;
              if (RVar4 < 0) {
                return -1;
              }
              current->chroma_scaling_from_luma = (RK_U8)local_38;
            }
            else {
              current->chroma_scaling_from_luma = '\0';
            }
            if ((((pAVar2->color_config).mono_chrome == '\0') &&
                (current->chroma_scaling_from_luma == '\0')) &&
               (((pAVar2->color_config).subsampling_x != '\x01' ||
                (((pAVar2->color_config).subsampling_y != '\x01' || (current->num_y_points != '\0'))
                )))) {
              RVar4 = mpp_av1_read_unsigned(gb,4,"num_cb_points",(RK_U32 *)&local_38,0,10);
              if (RVar4 < 0) {
                return -1;
              }
              current->num_cb_points = (RK_U8)local_38;
              uVar8 = (ulong)current->num_cb_points;
              if (current->num_cb_points != 0) {
                uVar7 = 0;
                do {
                  RVar6 = 0;
                  if (uVar7 != 0) {
                    RVar6 = current->point_cb_value[uVar7 - 1] + 1;
                  }
                  RVar4 = mpp_av1_read_unsigned
                                    (gb,8,"point_cb_value[i]",(RK_U32 *)&local_38,RVar6,
                                     ((int)uVar7 - (int)uVar8) + 0x100);
                  if (RVar4 < 0) {
                    return -1;
                  }
                  current->point_cb_value[uVar7] = (RK_U8)local_38;
                  RVar4 = mpp_av1_read_unsigned
                                    (gb,8,"point_cb_scaling[i]",(RK_U32 *)&local_38,0,0xff);
                  if (RVar4 < 0) {
                    return -1;
                  }
                  current->point_cb_scaling[uVar7] = (RK_U8)local_38;
                  uVar7 = uVar7 + 1;
                  uVar8 = (ulong)current->num_cb_points;
                } while (uVar7 < uVar8);
              }
              RVar4 = mpp_av1_read_unsigned(gb,4,"num_cr_points",(RK_U32 *)&local_38,0,10);
              if (RVar4 < 0) {
                return -1;
              }
              current->num_cr_points = (RK_U8)local_38;
              uVar8 = (ulong)current->num_cr_points;
              if (current->num_cr_points != 0) {
                uVar7 = 0;
                do {
                  RVar6 = 0;
                  if (uVar7 != 0) {
                    RVar6 = current->point_cr_value[uVar7 - 1] + 1;
                  }
                  RVar4 = mpp_av1_read_unsigned
                                    (gb,8,"point_cr_value[i]",(RK_U32 *)&local_38,RVar6,
                                     ((int)uVar7 - (int)uVar8) + 0x100);
                  if (RVar4 < 0) {
                    return -1;
                  }
                  current->point_cr_value[uVar7] = (RK_U8)local_38;
                  RVar4 = mpp_av1_read_unsigned
                                    (gb,8,"point_cr_scaling[i]",(RK_U32 *)&local_38,0,0xff);
                  if (RVar4 < 0) {
                    return -1;
                  }
                  current->point_cr_scaling[uVar7] = (RK_U8)local_38;
                  uVar7 = uVar7 + 1;
                  uVar8 = (ulong)current->num_cr_points;
                } while (uVar7 < uVar8);
              }
            }
            else {
              current->num_cb_points = '\0';
              current->num_cr_points = '\0';
            }
            RVar4 = mpp_av1_read_unsigned(gb,2,"grain_scaling_minus_8",(RK_U32 *)&local_38,0,3);
            if (RVar4 < 0) {
              return -1;
            }
            current->grain_scaling_minus_8 = (RK_U8)local_38;
            RVar4 = mpp_av1_read_unsigned(gb,2,"ar_coeff_lag",(RK_U32 *)&local_38,0,3);
            if (RVar4 < 0) {
              return -1;
            }
            current->ar_coeff_lag = (RK_U8)local_38;
            bVar1 = current->ar_coeff_lag;
            uVar3 = (bVar1 + 1) * (uint)bVar1 * 2;
            uVar5 = uVar3;
            if ((current->num_y_points != '\0') && (uVar5 = uVar3 | 1, bVar1 != 0)) {
              local_38 = CONCAT44(uVar3,(RK_U32)local_38) | 0x100000000;
              uVar8 = 0;
              do {
                RVar4 = mpp_av1_read_unsigned
                                  (gb,8,"ar_coeffs_y_plus_128[i]",(RK_U32 *)&local_38,0,0xff);
                if (RVar4 < 0) {
                  return -1;
                }
                current->ar_coeffs_y_plus_128[uVar8] = (RK_U8)local_38;
                uVar8 = uVar8 + 1;
              } while (uVar3 != uVar8);
              uVar5 = local_38._4_4_;
            }
            if (((current->chroma_scaling_from_luma != '\0') || (current->num_cb_points != '\0')) &&
               (0 < (int)uVar5)) {
              uVar8 = 1;
              if (1 < (int)uVar5) {
                uVar8 = (ulong)uVar5;
              }
              uVar7 = 0;
              do {
                RVar4 = mpp_av1_read_unsigned
                                  (gb,8,"ar_coeffs_cb_plus_128[i]",(RK_U32 *)&local_38,0,0xff);
                if (RVar4 < 0) {
                  return -1;
                }
                current->ar_coeffs_cb_plus_128[uVar7] = (RK_U8)local_38;
                uVar7 = uVar7 + 1;
              } while (uVar8 != uVar7);
            }
            if (((current->chroma_scaling_from_luma != '\0') || (current->num_cr_points != '\0')) &&
               (0 < (int)uVar5)) {
              uVar8 = 1;
              if (1 < (int)uVar5) {
                uVar8 = (ulong)uVar5;
              }
              uVar7 = 0;
              do {
                RVar4 = mpp_av1_read_unsigned
                                  (gb,8,"ar_coeffs_cr_plus_128[i]",(RK_U32 *)&local_38,0,0xff);
                if (RVar4 < 0) {
                  return -1;
                }
                current->ar_coeffs_cr_plus_128[uVar7] = (RK_U8)local_38;
                uVar7 = uVar7 + 1;
              } while (uVar8 != uVar7);
            }
            RVar4 = mpp_av1_read_unsigned(gb,2,"ar_coeff_shift_minus_6",(RK_U32 *)&local_38,0,3);
            if (RVar4 < 0) {
              return -1;
            }
            current->ar_coeff_shift_minus_6 = (RK_U8)local_38;
            RVar4 = mpp_av1_read_unsigned(gb,2,"grain_scale_shift",(RK_U32 *)&local_38,0,3);
            if (RVar4 < 0) {
              return -1;
            }
            current->grain_scale_shift = (RK_U8)local_38;
            if (current->num_cb_points != '\0') {
              RVar4 = mpp_av1_read_unsigned(gb,8,"cb_mult",(RK_U32 *)&local_38,0,0xff);
              if (RVar4 < 0) {
                return -1;
              }
              current->cb_mult = (RK_U8)local_38;
              RVar4 = mpp_av1_read_unsigned(gb,8,"cb_luma_mult",(RK_U32 *)&local_38,0,0xff);
              if (RVar4 < 0) {
                return -1;
              }
              current->cb_luma_mult = (RK_U8)local_38;
              RVar4 = mpp_av1_read_unsigned(gb,9,"cb_offset",(RK_U32 *)&local_38,0,0x1ff);
              if (RVar4 < 0) {
                return -1;
              }
              current->cb_offset = (RK_U16)local_38;
            }
            if (current->num_cr_points != '\0') {
              RVar4 = mpp_av1_read_unsigned(gb,8,"cr_mult",(RK_U32 *)&local_38,0,0xff);
              if (RVar4 < 0) {
                return -1;
              }
              current->cr_mult = (RK_U8)local_38;
              RVar4 = mpp_av1_read_unsigned(gb,8,"cr_luma_mult",(RK_U32 *)&local_38,0,0xff);
              if (RVar4 < 0) {
                return -1;
              }
              current->cr_luma_mult = (RK_U8)local_38;
              RVar4 = mpp_av1_read_unsigned(gb,9,"cr_offset",(RK_U32 *)&local_38,0,0x1ff);
              if (RVar4 < 0) {
                return -1;
              }
              current->cr_offset = (RK_U16)local_38;
            }
            RVar4 = mpp_av1_read_unsigned(gb,1,"overlap_flag",(RK_U32 *)&local_38,0,1);
            if (RVar4 < 0) {
              return -1;
            }
            current->overlap_flag = (RK_U8)local_38;
            RVar4 = mpp_av1_read_unsigned(gb,1,"clip_to_restricted_range",(RK_U32 *)&local_38,0,1);
            if (-1 < RVar4) {
              current->clip_to_restricted_range = (RK_U8)local_38;
              return 0;
            }
          }
          RVar4 = -1;
        }
      }
    }
  }
  return RVar4;
}

Assistant:

static RK_S32 mpp_av1_film_grain_params(AV1Context *ctx, BitReadCtx_t *gb,
                                        AV1RawFilmGrainParams *current,
                                        AV1RawFrameHeader *frame_header)
{
    const AV1RawSequenceHeader *seq = ctx->sequence_header;
    RK_S32 num_pos_luma, num_pos_chroma;
    RK_S32 i, err;

    if (!seq->film_grain_params_present ||
        (!frame_header->show_frame && !frame_header->showable_frame))
        return 0;

    flag(apply_grain);

    if (!current->apply_grain)
        return 0;

    fb(16, grain_seed);

    if (frame_header->frame_type == AV1_FRAME_INTER)
        flag(update_grain);
    else
        infer(update_grain, 1);

    if (!current->update_grain) {
        fb(3, film_grain_params_ref_idx);
        return 0;
    }

    fc(4, num_y_points, 0, 14);
    for (i = 0; i < current->num_y_points; i++) {
        fcs(8, point_y_value[i],
            i ? current->point_y_value[i - 1] + 1 : 0,
            MAX_UINT_BITS(8) - (current->num_y_points - i - 1),
            1, i);
        fbs(8, point_y_scaling[i], 1, i);
    }

    if (seq->color_config.mono_chrome)
        infer(chroma_scaling_from_luma, 0);
    else
        flag(chroma_scaling_from_luma);

    if (seq->color_config.mono_chrome ||
        current->chroma_scaling_from_luma ||
        (seq->color_config.subsampling_x == 1 &&
         seq->color_config.subsampling_y == 1 &&
         current->num_y_points == 0)) {
        infer(num_cb_points, 0);
        infer(num_cr_points, 0);
    } else {
        fc(4, num_cb_points, 0, 10);
        for (i = 0; i < current->num_cb_points; i++) {
            fcs(8, point_cb_value[i],
                i ? current->point_cb_value[i - 1] + 1 : 0,
                MAX_UINT_BITS(8) - (current->num_cb_points - i - 1),
                1, i);
            fbs(8, point_cb_scaling[i], 1, i);
        }
        fc(4, num_cr_points, 0, 10);
        for (i = 0; i < current->num_cr_points; i++) {
            fcs(8, point_cr_value[i],
                i ? current->point_cr_value[i - 1] + 1 : 0,
                MAX_UINT_BITS(8) - (current->num_cr_points - i - 1),
                1, i);
            fbs(8, point_cr_scaling[i], 1, i);
        }
    }

    fb(2, grain_scaling_minus_8);
    fb(2, ar_coeff_lag);
    num_pos_luma = 2 * current->ar_coeff_lag * (current->ar_coeff_lag + 1);
    if (current->num_y_points) {
        num_pos_chroma = num_pos_luma + 1;
        for (i = 0; i < num_pos_luma; i++)
            fbs(8, ar_coeffs_y_plus_128[i], 1, i);
    } else {
        num_pos_chroma = num_pos_luma;
    }
    if (current->chroma_scaling_from_luma || current->num_cb_points) {
        for (i = 0; i < num_pos_chroma; i++)
            fbs(8, ar_coeffs_cb_plus_128[i], 1, i);
    }
    if (current->chroma_scaling_from_luma || current->num_cr_points) {
        for (i = 0; i < num_pos_chroma; i++)
            fbs(8, ar_coeffs_cr_plus_128[i], 1, i);
    }
    fb(2, ar_coeff_shift_minus_6);
    fb(2, grain_scale_shift);
    if (current->num_cb_points) {
        fb(8, cb_mult);
        fb(8, cb_luma_mult);
        fb(9, cb_offset);
    }
    if (current->num_cr_points) {
        fb(8, cr_mult);
        fb(8, cr_luma_mult);
        fb(9, cr_offset);
    }

    flag(overlap_flag);
    flag(clip_to_restricted_range);

    return 0;
}